

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O2

long process_output_size(process_info_t *p)

{
  int iVar1;
  stat buf;
  
  iVar1 = fileno((FILE *)p->stdout_file);
  iVar1 = fstat64(iVar1,(stat64 *)&buf);
  if (iVar1 < 0) {
    buf.st_size = -1;
  }
  return buf.st_size;
}

Assistant:

long int process_output_size(process_info_t *p) {
  /* Size of the p->stdout_file */
  struct stat buf;

  int r = fstat(fileno(p->stdout_file), &buf);
  if (r < 0) {
    return -1;
  }

  return (long)buf.st_size;
}